

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O1

int i2d_PKCS7(PKCS7 *a,uchar **out)

{
  ulong size;
  uchar *puVar1;
  
  size = a->length;
  if ((size & 0xffffffff80000000) == 0) {
    if (out == (uchar **)0x0) goto LAB_0019e195;
    if (*out == (uchar *)0x0) {
      puVar1 = (uchar *)OPENSSL_memdup(a->asn1,size);
      *out = puVar1;
      if (puVar1 == (uchar *)0x0) goto LAB_0019e14c;
    }
    else {
      if (size != 0) {
        memcpy(*out,a->asn1,size);
      }
      *out = *out + a->length;
    }
    size = (ulong)(uint)a->length;
  }
  else {
    ERR_put_error(0x13,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_x509.cc"
                  ,0x144);
LAB_0019e14c:
    size = 0xffffffff;
  }
LAB_0019e195:
  return (int)size;
}

Assistant:

int i2d_PKCS7(const PKCS7 *p7, uint8_t **out) {
  if (p7->ber_len > INT_MAX) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
    return -1;
  }

  if (out == NULL) {
    return (int)p7->ber_len;
  }

  if (*out == NULL) {
    *out =
        reinterpret_cast<uint8_t *>(OPENSSL_memdup(p7->ber_bytes, p7->ber_len));
    if (*out == NULL) {
      return -1;
    }
  } else {
    OPENSSL_memcpy(*out, p7->ber_bytes, p7->ber_len);
    *out += p7->ber_len;
  }
  return (int)p7->ber_len;
}